

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void * cmCreateNewSourceFile(void *param_1)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0xb0);
  *puVar1 = 0;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  puVar1[9] = puVar1 + 0xb;
  puVar1[10] = 0;
  *(undefined1 *)(puVar1 + 0xb) = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  *(undefined4 *)(puVar1 + 0x11) = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = puVar1 + 0x11;
  puVar1[0x14] = puVar1 + 0x11;
  puVar1[0x15] = 0;
  return puVar1;
}

Assistant:

void * CCONV cmCreateNewSourceFile(void *)
{
  cmCPluginAPISourceFile *sf = new cmCPluginAPISourceFile;
  return (void*)sf;
}